

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
google::
dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::clear_to_size(dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                *this,size_type new_num_buckets)

{
  pointer ppVar1;
  dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *in_RSI;
  dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
  *in_RDI;
  size_type in_stack_ffffffffffffffd8;
  pointer in_stack_ffffffffffffffe8;
  
  if (in_RDI->table == (pointer)0x0) {
    ppVar1 = libc_allocator_with_realloc<std::pair<const_A,_int>_>::allocate
                       ((libc_allocator_with_realloc<std::pair<const_A,_int>_> *)in_RDI,
                        in_stack_ffffffffffffffd8,(const_pointer)0x10a0c06);
    in_RDI->table = ppVar1;
  }
  else {
    destroy_buckets(in_RDI,0,in_RDI->num_buckets);
    if (in_RSI != (dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                   *)in_RDI->num_buckets) {
      resize_table(in_RDI,in_RDI->num_buckets,in_RSI);
    }
  }
  fill_range_with_empty(in_RSI,in_stack_ffffffffffffffe8,(size_type)in_RDI);
  in_RDI->num_elements = 0;
  in_RDI->num_deleted = 0;
  in_RDI->num_buckets = (size_type)in_RSI;
  bucket_count(in_RDI);
  sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::reset_thresholds
            ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void clear_to_size(size_type new_num_buckets) {
    if (!table) {
      table = val_info.allocate(new_num_buckets);
    } else {
      destroy_buckets(0, num_buckets);
      if (new_num_buckets != num_buckets) {  // resize, if necessary
        typedef std::integral_constant<
            bool, std::is_same<value_alloc_type,
                               libc_allocator_with_realloc<value_type>>::value>
            realloc_ok;
        resize_table(num_buckets, new_num_buckets, realloc_ok());
      }
    }
    assert(table);
    fill_range_with_empty(table, new_num_buckets);
    num_elements = 0;
    num_deleted = 0;
    num_buckets = new_num_buckets;  // our new size
    settings.reset_thresholds(bucket_count());
  }